

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_digest.cc
# Opt level: O1

int ASN1_item_digest(ASN1_ITEM *it,EVP_MD *type,void *data,uchar *md,uint *len)

{
  int iVar1;
  uchar *str;
  uchar *local_28;
  
  local_28 = (uchar *)0x0;
  iVar1 = ASN1_item_i2d((ASN1_VALUE *)data,&local_28,it);
  if (local_28 == (uchar *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = EVP_Digest(local_28,(long)iVar1,md,len,type,(ENGINE *)0x0);
    OPENSSL_free(local_28);
  }
  return iVar1;
}

Assistant:

int ASN1_item_digest(const ASN1_ITEM *it, const EVP_MD *type, void *asn,
                     unsigned char *md, unsigned int *len) {
  int i, ret;
  unsigned char *str = NULL;

  i = ASN1_item_i2d(reinterpret_cast<ASN1_VALUE *>(asn), &str, it);
  if (!str) {
    return 0;
  }

  ret = EVP_Digest(str, i, md, len, type, NULL);
  OPENSSL_free(str);
  return ret;
}